

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O2

void __thiscall YAML::Scanner::ScanValue(Scanner *this)

{
  int iVar1;
  size_type sVar2;
  bool bVar3;
  _Elt_pointer pFVar4;
  ParserException *this_00;
  _Elt_pointer pFVar5;
  allocator local_81;
  Mark local_80;
  undefined1 local_70 [32];
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  pointer local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined8 uStack_24;
  
  bVar3 = VerifySimpleKey(this);
  this->m_canBeJSONFlow = false;
  if (bVar3) {
    this->m_simpleKeyAllowed = false;
  }
  else {
    pFVar4 = (this->m_flows).c.
             super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pFVar5 = (this->m_flows).c.
             super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pFVar5 == pFVar4) {
      if (this->m_simpleKeyAllowed == false) {
        this_00 = (ParserException *)__cxa_allocate_exception(0x40);
        local_80.pos = (this->INPUT).m_mark.pos;
        local_80.line = (this->INPUT).m_mark.line;
        local_80.column = (this->INPUT).m_mark.column;
        std::__cxx11::string::string((string *)local_70,"illegal map value",&local_81);
        ParserException::ParserException(this_00,&local_80,(string *)local_70);
        __cxa_throw(this_00,&ParserException::typeinfo,BadConversion::~BadConversion);
      }
      PushIndentTo(this,(this->INPUT).m_mark.column,MAP);
      pFVar4 = (this->m_flows).c.
               super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pFVar5 = (this->m_flows).c.
               super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    }
    this->m_simpleKeyAllowed = pFVar5 == pFVar4;
  }
  sVar2._0_4_ = (this->INPUT).m_mark.pos;
  sVar2._4_4_ = (this->INPUT).m_mark.line;
  iVar1 = (this->INPUT).m_mark.column;
  YAML::Stream::eat(&this->INPUT,1);
  local_70._24_8_ = &local_48;
  local_70._0_8_ = (pointer)0xf00000000;
  local_50 = 0;
  local_48._M_local_buf[0] = '\0';
  local_38 = (pointer)0x0;
  uStack_30 = 0;
  uStack_2c = 0;
  uStack_28 = 0;
  uStack_24 = 0;
  local_70._8_8_ = sVar2;
  local_70._16_4_ = iVar1;
  std::deque<YAML::Token,_std::allocator<YAML::Token>_>::emplace_back<YAML::Token>
            (&(this->m_tokens).c,(Token *)local_70);
  Token::~Token((Token *)local_70);
  return;
}

Assistant:

void Scanner::ScanValue() {
  // and check that simple key
  bool isSimpleKey = VerifySimpleKey();
  m_canBeJSONFlow = false;

  if (isSimpleKey) {
    // can't follow a simple key with another simple key (dunno why, though - it
    // seems fine)
    m_simpleKeyAllowed = false;
  } else {
    // handle values differently in the block context (and manage indents)
    if (InBlockContext()) {
      if (!m_simpleKeyAllowed)
        throw ParserException(INPUT.mark(), ErrorMsg::MAP_VALUE);

      PushIndentTo(INPUT.column(), IndentMarker::MAP);
    }

    // can only put a simple key here if we're in block context
    m_simpleKeyAllowed = InBlockContext();
  }

  // eat
  Mark mark = INPUT.mark();
  INPUT.eat(1);
  m_tokens.push(Token(Token::VALUE, mark));
}